

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

DoubletSet * GenerateDoubletTargets(DAM *am,DoubletType type)

{
  int iVar1;
  int *piVar2;
  set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *this;
  long in_RSI;
  DoubletSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<Doublet>,_bool> pVar3;
  int j;
  Gaussian cur2;
  int i;
  Gaussian cur1;
  int nam2;
  int nam1;
  DoubletSet *ds;
  int in_stack_fffffffffffffeec;
  _Rb_tree_const_iterator<Doublet> in_stack_fffffffffffffef0;
  value_type *pvVar4;
  value_type *__x;
  string local_70 [32];
  int local_50;
  int local_40;
  int local_30;
  int local_1c;
  undefined1 local_15;
  
  local_15 = 0;
  std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::set
            ((set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)0x1129ed);
  piVar2 = DAM::operator[]((DAM *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffeec);
  iVar1 = *piVar2;
  piVar2 = DAM::operator[]((DAM *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffeec);
  local_1c = ((iVar1 + 1) * (*piVar2 + 2)) / 2;
  piVar2 = DAM::operator[]((DAM *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffeec);
  iVar1 = *piVar2;
  piVar2 = DAM::operator[]((DAM *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffeec);
  local_30 = ((iVar1 + 1) * (*piVar2 + 2)) / 2;
  pvVar4 = (value_type *)&stack0xffffffffffffffc4;
  this = (set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_> *)
         DAM::operator[]((DAM *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffeec);
  __x = pvVar4;
  ((ExpList *)&pvVar4->type)->_M_elems[0] = *(int *)&(this->_M_t)._M_impl;
  (pvVar4->left).ijk._M_elems[0] = 0;
  (pvVar4->left).ijk._M_elems[1] = 0;
  for (local_40 = 0; local_40 < local_1c; local_40 = local_40 + 1) {
    DAM::operator[]((DAM *)in_stack_fffffffffffffef0._M_node,in_stack_fffffffffffffeec);
    for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
      std::__cxx11::string::string(local_70,(string *)(in_RSI + 8));
      pVar3 = std::set<Doublet,_std::less<Doublet>,_std::allocator<Doublet>_>::insert(this,__x);
      in_stack_fffffffffffffef0 = pVar3.first._M_node;
      in_stack_fffffffffffffeec = CONCAT13(pVar3.second,(int3)in_stack_fffffffffffffeec);
      Doublet::~Doublet((Doublet *)0x112bf5);
      Gaussian::Iterate((Gaussian *)__x);
    }
    Gaussian::Iterate((Gaussian *)__x);
  }
  return in_RDI;
}

Assistant:

DoubletSet GenerateDoubletTargets(DAM am, DoubletType type)
{
    DoubletSet ds;
    int nam1 = ((am[0] + 1) * (am[0] + 2)) / 2;
    int nam2 = ((am[1] + 1) * (am[1] + 2)) / 2;

    Gaussian cur1 = Gaussian{am[0], 0, 0};
    for(int i = 0; i < nam1; i++)
    {
        Gaussian cur2 = Gaussian{am[1], 0, 0};
        for(int j = 0; j < nam2; j++)
        {
            ds.insert(Doublet{type, cur1, cur2, am.tag});
            cur2.Iterate();
        }
        cur1.Iterate();
    }
                
    return ds;
}